

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dump_fnobj(LispPTR index)

{
  LispPTR *pLVar1;
  
  if ((index & 0xfff0000) == 0) {
    pLVar1 = (LispPTR *)(AtomSpace + (ulong)(index * 5) * 2);
  }
  else {
    pLVar1 = NativeAligned4FromLAddr(index);
  }
  dump_fnbody(pLVar1[2]);
  return;
}

Assistant:

void dump_fnobj(LispPTR index)
/* atom index */
{
  LispPTR *defcell68k;

  defcell68k = GetDEFCELL68k(index);
  dump_fnbody(*defcell68k);

}